

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pizza_cutter.cpp
# Opt level: O3

bool __thiscall pizza_cutter::is_new_part_valid(pizza_cutter *this,pizza_slice new_part)

{
  pointer pvVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int *piVar7;
  
  bVar2 = false;
  if (((-1 < (long)new_part._0_8_) && (uVar5 = new_part.row1, -1 < (int)uVar5)) &&
     (pvVar1 = (this->pizza_).
               super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start, bVar2 = false,
     (ulong)(new_part._8_8_ >> 0x20) <
     (ulong)((long)*(pointer *)
                    ((long)&(pvVar1->super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>).
                            _M_impl.super__Vector_impl_data + 8) -
             *(long *)&(pvVar1->super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>)._M_impl
                       .super__Vector_impl_data >> 3))) {
    iVar3 = new_part.row2;
    if ((ulong)(long)iVar3 <
        (ulong)(((long)(this->pizza_).
                       super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
               -0x5555555555555555)) {
      bVar2 = true;
      if ((int)uVar5 <= iVar3) {
        uVar6 = (ulong)(uVar5 & 0x7fffffff);
        do {
          if (new_part.col1 <= new_part.col2) {
            piVar7 = (int *)(*(long *)&pvVar1[uVar6].
                                       super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>.
                                       _M_impl + (new_part._0_8_ >> 0x20) * 8 + 4);
            iVar4 = new_part.col1 + -1;
            do {
              if (*piVar7 != -1) goto LAB_001035f1;
              iVar4 = iVar4 + 1;
              piVar7 = piVar7 + 2;
            } while (iVar4 < new_part.col2);
          }
          iVar4 = (int)uVar6;
          uVar6 = uVar6 + 1;
        } while (iVar4 < iVar3);
      }
    }
    else {
LAB_001035f1:
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool pizza_cutter::is_new_part_valid(pizza_slice new_part) const noexcept
{
    if (new_part.col1 < 0 || new_part.col2 >= pizza_[0].size() ||
        new_part.row1 < 0 || new_part.row2 >= pizza_.size()) {
        return false;
    }

    for (int row = new_part.row1; row <= new_part.row2; ++row) {
        for (int col = new_part.col1; col <= new_part.col2; ++col) {
            if (pizza_[row][col].owner != -1)
                return false;
        }
    }

    return true;
}